

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
::find_non_soo<upb_MiniTable_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
           *this,key_arg<const_upb_MiniTable_*> *key,size_t hash)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  uint uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  bool bVar20;
  ushort uVar21;
  ctrl_t *pcVar22;
  slot_type *ppuVar23;
  ulong uVar24;
  uint uVar25;
  ulong i;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  iterator iVar29;
  iterator iVar30;
  __m128i match;
  ulong local_90;
  ctrl_t *local_78;
  anon_union_8_1_a8a14541_for_iterator_2 local_68;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  
  uVar2 = *(ulong *)this;
  if (uVar2 == 1) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xdb0,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>, K = const upb_MiniTable *]"
                 );
  }
  if (uVar2 == 0) {
LAB_001119c7:
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  local_90 = (hash >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar2;
  pcVar22 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
            ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                       *)this);
  auVar26 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar26 = pshuflw(auVar26,auVar26,0);
  uVar24 = 0;
  do {
    pcVar1 = pcVar22 + local_90;
    cVar4 = *pcVar1;
    cVar5 = pcVar1[1];
    cVar6 = pcVar1[2];
    cVar7 = pcVar1[3];
    cVar8 = pcVar1[4];
    cVar9 = pcVar1[5];
    cVar10 = pcVar1[6];
    cVar11 = pcVar1[7];
    cVar12 = pcVar1[8];
    cVar13 = pcVar1[9];
    cVar14 = pcVar1[10];
    cVar15 = pcVar1[0xb];
    cVar16 = pcVar1[0xc];
    cVar17 = pcVar1[0xd];
    cVar18 = pcVar1[0xe];
    cVar19 = pcVar1[0xf];
    local_58 = auVar26[0];
    cStack_57 = auVar26[1];
    cStack_56 = auVar26[2];
    cStack_55 = auVar26[3];
    auVar27[0] = -(local_58 == cVar4);
    auVar27[1] = -(cStack_57 == cVar5);
    auVar27[2] = -(cStack_56 == cVar6);
    auVar27[3] = -(cStack_55 == cVar7);
    auVar27[4] = -(local_58 == cVar8);
    auVar27[5] = -(cStack_57 == cVar9);
    auVar27[6] = -(cStack_56 == cVar10);
    auVar27[7] = -(cStack_55 == cVar11);
    auVar27[8] = -(local_58 == cVar12);
    auVar27[9] = -(cStack_57 == cVar13);
    auVar27[10] = -(cStack_56 == cVar14);
    auVar27[0xb] = -(cStack_55 == cVar15);
    auVar27[0xc] = -(local_58 == cVar16);
    auVar27[0xd] = -(cStack_57 == cVar17);
    auVar27[0xe] = -(cStack_56 == cVar18);
    auVar27[0xf] = -(cStack_55 == cVar19);
    uVar21 = (ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf;
    uVar25 = (uint)uVar21;
    while( true ) {
      iVar29.field_1.slot_ = local_68.slot_;
      iVar29.ctrl_ = local_78;
      if (uVar21 == 0) break;
      uVar3 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      ppuVar23 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                 ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                               *)this);
      i = uVar3 + local_90 & uVar2;
      if (ppuVar23[i] == *key) {
        iVar29 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                 ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                                *)this,i);
        break;
      }
      uVar21 = (ushort)(uVar25 - 1) & (ushort)uVar25;
      uVar25 = CONCAT22((short)(uVar25 - 1 >> 0x10),uVar21);
    }
    local_68 = iVar29.field_1;
    local_78 = iVar29.ctrl_;
    if (uVar21 != 0) {
      bVar20 = false;
    }
    else {
      auVar28[0] = -(cVar4 == kEmpty);
      auVar28[1] = -(cVar5 == kEmpty);
      auVar28[2] = -(cVar6 == kEmpty);
      auVar28[3] = -(cVar7 == kEmpty);
      auVar28[4] = -(cVar8 == kEmpty);
      auVar28[5] = -(cVar9 == kEmpty);
      auVar28[6] = -(cVar10 == kEmpty);
      auVar28[7] = -(cVar11 == kEmpty);
      auVar28[8] = -(cVar12 == kEmpty);
      auVar28[9] = -(cVar13 == kEmpty);
      auVar28[10] = -(cVar14 == kEmpty);
      auVar28[0xb] = -(cVar15 == kEmpty);
      auVar28[0xc] = -(cVar16 == kEmpty);
      auVar28[0xd] = -(cVar17 == kEmpty);
      auVar28[0xe] = -(cVar18 == kEmpty);
      auVar28[0xf] = -(cVar19 == kEmpty);
      if ((((((((((((((((auVar28 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar28 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar28 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar28 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar28 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar28 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar28 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar28 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar28 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar28 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar28 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar28 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar28[0xf])
      {
        if (*(ulong *)this == 0) goto LAB_001119c7;
        if (*(ulong *)this < uVar24 + 0x10) {
          __assert_fail("seq.index() <= capacity() && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdbd,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>, K = const upb_MiniTable *]"
                       );
        }
        local_90 = local_90 + uVar24 + 0x10 & uVar2;
        bVar20 = true;
        uVar24 = uVar24 + 0x10;
      }
      else {
        local_78 = (ctrl_t *)0x0;
        bVar20 = false;
      }
    }
    if (!bVar20) {
      iVar30.field_1.slot_ = local_68.slot_;
      iVar30.ctrl_ = local_78;
      return iVar30;
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    assert(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }